

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant.h
# Opt level: O0

int IsFlatSource16(uint8_t *src)

{
  int iVar1;
  int i;
  uint32_t v;
  uint8_t *src_local;
  
  iVar1 = (uint)*src * 0x1010101;
  i = 0;
  src_local = src;
  while( true ) {
    if (0xf < i) {
      return 1;
    }
    if ((((*(int *)src_local != iVar1) || (*(int *)(src_local + 4) != iVar1)) ||
        (*(int *)(src_local + 8) != iVar1)) || (*(int *)(src_local + 0xc) != iVar1)) break;
    src_local = src_local + 0x20;
    i = i + 1;
  }
  return 0;
}

Assistant:

static WEBP_INLINE int IsFlatSource16(const uint8_t* src) {
  const uint32_t v = src[0] * 0x01010101u;
  int i;
  for (i = 0; i < 16; ++i) {
    if (memcmp(src + 0, &v, 4) || memcmp(src +  4, &v, 4) ||
        memcmp(src + 8, &v, 4) || memcmp(src + 12, &v, 4)) {
      return 0;
    }
    src += BPS;
  }
  return 1;
}